

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bsplitscb(const_bstring str,const_bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,
             void *parm)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  charField chrs;
  
  uVar2 = 0xffffffff;
  if ((((-1 < pos) && (str != (const_bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     ((uVar6 = str->slen, splitStr != (const_bstring)0x0 && pos <= (int)uVar6 &&
      (iVar4 = splitStr->slen, -1 < iVar4)))) {
    if (iVar4 == 1) {
      iVar4 = bsplitcb(str,*splitStr->data,pos,cb,parm);
      return iVar4;
    }
    if (iVar4 == 0) {
      uVar2 = (*cb)(parm,0,uVar6);
      uVar2 = uVar2 & (int)uVar2 >> 0x1f;
    }
    else {
      buildCharField(&chrs,splitStr);
      do {
        uVar5 = (ulong)(uint)pos;
        uVar3 = pos;
        if (pos <= (int)uVar6) {
          uVar3 = uVar6;
        }
        do {
          if ((int)uVar6 <= (int)uVar5) goto LAB_001306af;
          pbVar1 = str->data + uVar5;
          uVar5 = uVar5 + 1;
        } while ((chrs.content[*pbVar1 >> 3] >> (*pbVar1 & 7) & 1) == 0);
        uVar3 = (int)uVar5 - 1;
LAB_001306af:
        iVar4 = (*cb)(parm,pos,uVar3 - pos);
        if (iVar4 < 0) {
          return iVar4;
        }
        pos = uVar3 + 1;
        uVar6 = str->slen;
        uVar2 = 0;
      } while ((int)uVar3 < (int)uVar6);
    }
  }
  return uVar2;
}

Assistant:

int bsplitscb (const_bstring str, const_bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
struct charField chrs;
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;
	if (splitStr->slen == 0) {
		if ((ret = cb (parm, 0, str->slen)) > 0) ret = 0;
		return ret;
	}

	if (splitStr->slen == 1)
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	buildCharField (&chrs, splitStr);

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (testInCharField (&chrs, str->data[i])) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return BSTR_OK;
}